

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Prepare(sqlite3 *db,char *zSql,int nBytes,u32 prepFlags,Vdbe *pReprepare,
                  sqlite3_stmt **ppStmt,char **pzTail)

{
  Btree *p;
  Table *p_00;
  u8 prepFlags_00;
  char *zSql_00;
  TriggerPrg *pT;
  int mxLen;
  char *zSqlCopy;
  char *zDb;
  Btree *pBt;
  Parse sParse;
  int i;
  int rc;
  sqlite3_stmt **ppStmt_local;
  Vdbe *pReprepare_local;
  u32 prepFlags_local;
  int nBytes_local;
  char *zSql_local;
  sqlite3 *db_local;
  
  sParse.pRename._4_4_ = 0;
  memset(&sParse,0,0xd8);
  memset(&sParse.sNameToken.n,0,0x88);
  sParse.aTempReg._24_8_ = db->pParse;
  db->pParse = (Parse *)&pBt;
  pBt = (Btree *)db;
  sParse.pVList = (VList *)pReprepare;
  if (db->mallocFailed != '\0') {
    sqlite3ErrorMsg((Parse *)&pBt,"out of memory");
  }
  if ((prepFlags & 1) != 0) {
    sParse.colNamesSet = sParse.colNamesSet + '\x01';
    (db->lookaside).bDisable = (db->lookaside).bDisable + 1;
    (db->lookaside).sz = 0;
  }
  prepFlags_00 = (u8)prepFlags;
  sParse.checkSchema = prepFlags_00;
  if (db->noSharedCache == '\0') {
    for (sParse.pRename._0_4_ = 0; (int)sParse.pRename < db->nDb;
        sParse.pRename._0_4_ = (int)sParse.pRename + 1) {
      p = db->aDb[(int)sParse.pRename].pBt;
      if (p != (Btree *)0x0) {
        sParse.pRename._4_4_ = sqlite3BtreeSchemaLocked(p);
        if (sParse.pRename._4_4_ != 0) {
          sqlite3ErrorWithMsg(db,sParse.pRename._4_4_,"database schema is locked: %s",
                              db->aDb[(int)sParse.pRename].zDbSName);
          goto LAB_00205d00;
        }
        sParse.pRename._4_4_ = 0;
      }
    }
  }
  if (db->pDisconnect != (VTable *)0x0) {
    sqlite3VtabUnlockList(db);
  }
  if ((nBytes < 0) || ((nBytes != 0 && (zSql[nBytes + -1] == '\0')))) {
    sqlite3RunParser((Parse *)&pBt,zSql);
  }
  else {
    if (db->aLimit[1] < nBytes) {
      sqlite3ErrorWithMsg(db,0x12,"statement too long");
      sParse.pRename._4_4_ = sqlite3ApiExit(db,0x12);
      goto LAB_00205d00;
    }
    zSql_00 = sqlite3DbStrNDup(db,zSql,(long)nBytes);
    if (zSql_00 == (char *)0x0) {
      sParse.pReprepare = (Vdbe *)(zSql + nBytes);
    }
    else {
      sqlite3RunParser((Parse *)&pBt,zSql_00);
      sParse.pReprepare = (Vdbe *)(zSql + ((long)sParse.pReprepare - (long)zSql_00));
      sqlite3DbFree(db,zSql_00);
    }
  }
  if (pzTail != (char **)0x0) {
    *pzTail = (char *)sParse.pReprepare;
  }
  if ((db->init).busy == '\0') {
    sqlite3VdbeSetSql((Vdbe *)sParse.zErrMsg,zSql,(int)sParse.pReprepare - (int)zSql,prepFlags_00);
  }
  if (db->mallocFailed != '\0') {
    sParse.pVdbe._0_4_ = 7;
    sParse.pVdbe._5_1_ = '\0';
  }
  if (((int)sParse.pVdbe == 0) || ((int)sParse.pVdbe == 0x65)) {
    *ppStmt = (sqlite3_stmt *)sParse.zErrMsg;
    sParse.pRename._4_4_ = 0;
    sqlite3ErrorClear(db);
  }
  else {
    if ((sParse.pVdbe._5_1_ != '\0') && ((db->init).busy == '\0')) {
      schemaIsValid((Parse *)&pBt);
    }
    if (sParse.zErrMsg != (char *)0x0) {
      sqlite3VdbeFinalize((Vdbe *)sParse.zErrMsg);
    }
    sParse.pRename._4_4_ = (int)sParse.pVdbe;
    if (sParse.db == (sqlite3 *)0x0) {
      sqlite3Error(db,(int)sParse.pVdbe);
    }
    else {
      sqlite3ErrorWithMsg(db,(int)sParse.pVdbe,"%s",sParse.db);
      sqlite3DbFree(db,sParse.db);
    }
  }
  while (p_00 = sParse.pTriggerTab, sParse.pTriggerTab != (Table *)0x0) {
    sParse.pTriggerTab = (Table *)(sParse.pTriggerTab)->aCol;
    sqlite3DbFree(db,p_00);
  }
LAB_00205d00:
  sqlite3ParseObjectReset((Parse *)&pBt);
  return sParse.pRename._4_4_;
}

Assistant:

static int sqlite3Prepare(
  sqlite3 *db,              /* Database handle. */
  const char *zSql,         /* UTF-8 encoded SQL statement. */
  int nBytes,               /* Length of zSql in bytes. */
  u32 prepFlags,            /* Zero or more SQLITE_PREPARE_* flags */
  Vdbe *pReprepare,         /* VM being reprepared */
  sqlite3_stmt **ppStmt,    /* OUT: A pointer to the prepared statement */
  const char **pzTail       /* OUT: End of parsed string */
){
  int rc = SQLITE_OK;       /* Result code */
  int i;                    /* Loop counter */
  Parse sParse;             /* Parsing context */

  /* sqlite3ParseObjectInit(&sParse, db); // inlined for performance */
  memset(PARSE_HDR(&sParse), 0, PARSE_HDR_SZ);
  memset(PARSE_TAIL(&sParse), 0, PARSE_TAIL_SZ);
  sParse.pOuterParse = db->pParse;
  db->pParse = &sParse;
  sParse.db = db;
  sParse.pReprepare = pReprepare;
  assert( ppStmt && *ppStmt==0 );
  if( db->mallocFailed ) sqlite3ErrorMsg(&sParse, "out of memory");
  assert( sqlite3_mutex_held(db->mutex) );

  /* For a long-term use prepared statement avoid the use of
  ** lookaside memory.
  */
  if( prepFlags & SQLITE_PREPARE_PERSISTENT ){
    sParse.disableLookaside++;
    DisableLookaside;
  }
  sParse.prepFlags = prepFlags & 0xff;

  /* Check to verify that it is possible to get a read lock on all
  ** database schemas.  The inability to get a read lock indicates that
  ** some other database connection is holding a write-lock, which in
  ** turn means that the other connection has made uncommitted changes
  ** to the schema.
  **
  ** Were we to proceed and prepare the statement against the uncommitted
  ** schema changes and if those schema changes are subsequently rolled
  ** back and different changes are made in their place, then when this
  ** prepared statement goes to run the schema cookie would fail to detect
  ** the schema change.  Disaster would follow.
  **
  ** This thread is currently holding mutexes on all Btrees (because
  ** of the sqlite3BtreeEnterAll() in sqlite3LockAndPrepare()) so it
  ** is not possible for another thread to start a new schema change
  ** while this routine is running.  Hence, we do not need to hold
  ** locks on the schema, we just need to make sure nobody else is
  ** holding them.
  **
  ** Note that setting READ_UNCOMMITTED overrides most lock detection,
  ** but it does *not* override schema lock detection, so this all still
  ** works even if READ_UNCOMMITTED is set.
  */
  if( !db->noSharedCache ){
    for(i=0; i<db->nDb; i++) {
      Btree *pBt = db->aDb[i].pBt;
      if( pBt ){
        assert( sqlite3BtreeHoldsMutex(pBt) );
        rc = sqlite3BtreeSchemaLocked(pBt);
        if( rc ){
          const char *zDb = db->aDb[i].zDbSName;
          sqlite3ErrorWithMsg(db, rc, "database schema is locked: %s", zDb);
          testcase( db->flags & SQLITE_ReadUncommit );
          goto end_prepare;
        }
      }
    }
  }

#ifndef SQLITE_OMIT_VIRTUALTABLE
  if( db->pDisconnect ) sqlite3VtabUnlockList(db);
#endif

  if( nBytes>=0 && (nBytes==0 || zSql[nBytes-1]!=0) ){
    char *zSqlCopy;
    int mxLen = db->aLimit[SQLITE_LIMIT_SQL_LENGTH];
    testcase( nBytes==mxLen );
    testcase( nBytes==mxLen+1 );
    if( nBytes>mxLen ){
      sqlite3ErrorWithMsg(db, SQLITE_TOOBIG, "statement too long");
      rc = sqlite3ApiExit(db, SQLITE_TOOBIG);
      goto end_prepare;
    }
    zSqlCopy = sqlite3DbStrNDup(db, zSql, nBytes);
    if( zSqlCopy ){
      sqlite3RunParser(&sParse, zSqlCopy);
      sParse.zTail = &zSql[sParse.zTail-zSqlCopy];
      sqlite3DbFree(db, zSqlCopy);
    }else{
      sParse.zTail = &zSql[nBytes];
    }
  }else{
    sqlite3RunParser(&sParse, zSql);
  }
  assert( 0==sParse.nQueryLoop );

  if( pzTail ){
    *pzTail = sParse.zTail;
  }

  if( db->init.busy==0 ){
    sqlite3VdbeSetSql(sParse.pVdbe, zSql, (int)(sParse.zTail-zSql), prepFlags);
  }
  if( db->mallocFailed ){
    sParse.rc = SQLITE_NOMEM_BKPT;
    sParse.checkSchema = 0;
  }
  if( sParse.rc!=SQLITE_OK && sParse.rc!=SQLITE_DONE ){
    if( sParse.checkSchema && db->init.busy==0 ){
      schemaIsValid(&sParse);
    }
    if( sParse.pVdbe ){
      sqlite3VdbeFinalize(sParse.pVdbe);
    }
    assert( 0==(*ppStmt) );
    rc = sParse.rc;
    if( sParse.zErrMsg ){
      sqlite3ErrorWithMsg(db, rc, "%s", sParse.zErrMsg);
      sqlite3DbFree(db, sParse.zErrMsg);
    }else{
      sqlite3Error(db, rc);
    }
  }else{
    assert( sParse.zErrMsg==0 );
    *ppStmt = (sqlite3_stmt*)sParse.pVdbe;
    rc = SQLITE_OK;
    sqlite3ErrorClear(db);
  }


  /* Delete any TriggerPrg structures allocated while parsing this statement. */
  while( sParse.pTriggerPrg ){
    TriggerPrg *pT = sParse.pTriggerPrg;
    sParse.pTriggerPrg = pT->pNext;
    sqlite3DbFree(db, pT);
  }

end_prepare:

  sqlite3ParseObjectReset(&sParse);
  return rc;
}